

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_clock.cpp
# Opt level: O0

void __thiscall sc_core::sc_clock::report_error(sc_clock *this,char *id,char *add_msg)

{
  ostream *poVar1;
  char *pcVar2;
  char *in_RDX;
  stringstream msg;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [4];
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  sc_severity in_stack_fffffffffffffe94;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (in_RDX != (char *)0x0) {
    poVar1 = std::operator<<(local_190,in_RDX);
    std::operator<<(poVar1,": ");
  }
  poVar1 = std::operator<<(local_190,"clock \'");
  pcVar2 = sc_object::name((sc_object *)0x21e928);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  sc_report_handler::report
            (in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void
sc_clock::report_error( const char* id, const char* add_msg ) const
{
    std::stringstream msg;
    if( add_msg != 0 )
      msg << add_msg << ": ";
    msg << "clock '" << name() << "'";
    SC_REPORT_ERROR( id, msg.str().c_str() );
}